

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

int canvas_open_iter(char *path,t_canvasopen *co)

{
  int iVar1;
  
  iVar1 = sys_trytoopenone(path,co->name,co->ext,co->dirresult,co->nameresult,co->size,co->bin);
  if (iVar1 >= 0) {
    co->fd = iVar1;
  }
  return (uint)(iVar1 < 0);
}

Assistant:

static int canvas_open_iter(const char *path, t_canvasopen *co)
{
    int fd;
    if ((fd = sys_trytoopenone(path, co->name, co->ext,
        co->dirresult, co->nameresult, co->size, co->bin)) >= 0)
    {
        co->fd = fd;
        return 0;
    }
    return 1;
}